

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O0

uchar * bam_aux_get(int aux_data_len,uchar *aux_start,char *tag)

{
  byte bVar1;
  uint x;
  int iVar2;
  byte *pbVar3;
  char *in_RDX;
  byte *in_RSI;
  int in_EDI;
  uint len;
  int size;
  int type;
  uchar *p;
  byte *local_28;
  
  local_28 = in_RSI;
  while( true ) {
    if (in_RSI + in_EDI <= local_28) {
      return (uchar *)0x0;
    }
    if (((uint)*local_28 == (int)*in_RDX) && ((uint)local_28[1] == (int)in_RDX[1])) break;
    pbVar3 = local_28 + 3;
    x = (uint)local_28[2];
    if (x == 0x42) {
      iVar2 = bam_aux_type2size((uint)*pbVar3);
      local_28 = local_28 + (ulong)(uint)(*(int *)(local_28 + 4) * iVar2) + 8;
    }
    else {
      local_28 = pbVar3;
      if ((x == 0x5a) || (x == 0x48)) {
        do {
          pbVar3 = local_28 + 1;
          bVar1 = *local_28;
          local_28 = pbVar3;
        } while (bVar1 != 0);
      }
      else {
        iVar2 = bam_aux_type2size(x);
        local_28 = pbVar3 + iVar2;
      }
    }
  }
  return local_28 + 2;
}

Assistant:

static unsigned char* bam_aux_get(int aux_data_len, const unsigned char* aux_start, const char* tag)
{
    const unsigned char* p = aux_start;
    while (p < aux_start + aux_data_len) {
        if (p[0] == tag[0] && p[1] == tag[1]) return (unsigned char*)(p + 2);
        p += 2;           // skip tag
        int type = *p++;  // read type
        if (type == 'B') {
            int size = bam_aux_type2size(*p++);  // read array type
            unsigned len =
                (unsigned)p[0] | (unsigned)p[1] << 8 | (unsigned)p[2] << 16 | (unsigned)p[3] << 24;
            p += 4;           // skip the size field
            p += len * size;  // skip array
        } else if (type == 'Z' || type == 'H') {
            while (*p++ != 0) {
            }  // skip NULL terminated string
        } else {
            p += bam_aux_type2size(type);  // skip value
        }
    }
    return NULL;
}